

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureBarrierTests.cpp
# Opt level: O3

int __thiscall gl4cts::TextureBarrierTests::init(TextureBarrierTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TextureBarrierBasicOutline *pTVar1;
  
  pTVar1 = (TextureBarrierBasicOutline *)operator_new(0x110);
  TextureBarrierBasicOutline::TextureBarrierBasicOutline
            (pTVar1,(this->super_TestCaseGroup).m_context,this->m_api,"disjoint-texels",
             "Using the basic outline test that reads and writes from/to disjoint sets of texels work as expected. Repeat the test with multiple different block size values (including a block size of one). Repeat the actual rendering pass multiple times within a single test using a fixed value for blockSize and modulo. Because the set of read and written texels stays disjoint the result should still be well defined even without the use of any synchronization primitive."
            );
  pTVar1[1].super_TextureBarrierBaseTest.super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
       = (_func_int **)0xffffffffffffffff;
  pTVar1[1].super_TextureBarrierBaseTest.super_TestCase.super_TestCase.super_TestNode.m_testCtx =
       (TestContext *)0x0;
  (pTVar1->super_TextureBarrierBaseTest).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
       = (_func_int **)&PTR__TestCase_020ebd50;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TextureBarrierBasicOutline *)operator_new(0x110);
  TextureBarrierBasicOutline::TextureBarrierBasicOutline
            (pTVar1,(this->super_TestCaseGroup).m_context,this->m_api,"overlapping-texels",
             "Using the basic outline test that reads and writes from/to overlapping sets of texels work as expected if there is a call to TextureBarrier between subsequent rendering passes. Test this by using different values for blockSize and modulo for each rendering pass."
            );
  pTVar1[1].super_TextureBarrierBaseTest.super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
       = (_func_int **)0xffffffffffffffff;
  pTVar1[1].super_TextureBarrierBaseTest.super_TestCase.super_TestCase.super_TestNode.m_testCtx =
       (TestContext *)0x0;
  (pTVar1->super_TextureBarrierBaseTest).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
       = (_func_int **)&PTR__TestCase_020ebee0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TextureBarrierBasicOutline *)operator_new(0x100);
  TextureBarrierBasicOutline::TextureBarrierBasicOutline
            (pTVar1,(this->super_TestCaseGroup).m_context,this->m_api,"same-texel-rw",
             "Using the basic outline tests that a single read and write of each texel, where the read is in the fragment shader invocation that writes the same texel, works as expected."
            );
  (pTVar1->super_TextureBarrierBaseTest).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
       = (_func_int **)&PTR__TestCase_020ebf78;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TextureBarrierBasicOutline *)operator_new(0x100);
  TextureBarrierBasicOutline::TextureBarrierBasicOutline
            (pTVar1,(this->super_TestCaseGroup).m_context,this->m_api,"same-texel-rw-multipass",
             "Using the basic outline tests that multiple reads and writes of each texel, where the read is in the fragment shader invocation that writes the same texel, works as expected if there is a call to TextureBarrier between each subsequent read-after-write."
            );
  (pTVar1->super_TextureBarrierBaseTest).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
       = (_func_int **)&PTR__TestCase_020ec018;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  return extraout_EAX;
}

Assistant:

void TextureBarrierTests::init(void)
{
	addChild(new TextureBarrierDisjointTexels(m_context, m_api, "disjoint-texels"));
	addChild(new TextureBarrierOverlappingTexels(m_context, m_api, "overlapping-texels"));
	addChild(new TextureBarrierSameTexelRW(m_context, m_api, "same-texel-rw"));
	addChild(new TextureBarrierSameTexelRWMultipass(m_context, m_api, "same-texel-rw-multipass"));
}